

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O2

ssize_t cf_socket_send(Curl_cfilter *cf,Curl_easy *data,void *buf,size_t len,CURLcode *err)

{
  curl_socket_t cVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  int *piVar5;
  char *pcVar6;
  char buffer [256];
  char local_138 [264];
  
  pvVar3 = cf->ctx;
  *err = CURLE_OK;
  cVar1 = cf->conn->sock[cf->sockindex];
  iVar2 = *(int *)((long)pvVar3 + 0x98);
  cf->conn->sock[cf->sockindex] = iVar2;
  uVar4 = send(iVar2,buf,len,0x4000);
  if (uVar4 == 0xffffffffffffffff) {
    piVar5 = __errno_location();
    iVar2 = *piVar5;
    if (((iVar2 == 4) || (iVar2 == 0x73)) || (iVar2 == 0xb)) {
      *err = CURLE_AGAIN;
      goto LAB_005176bd;
    }
    pcVar6 = Curl_strerror(iVar2,local_138,0x100);
    Curl_failf(data,"Send failure: %s",pcVar6);
    (data->state).os_errno = iVar2;
    *err = CURLE_SEND_ERROR;
  }
  else {
LAB_005176bd:
    if (data == (Curl_easy *)0x0) goto LAB_005176f3;
  }
  if ((((data->set).field_0x8bd & 0x10) != 0) && (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"send(len=%zu) -> %d, err=%d",len,uVar4 & 0xffffffff,(ulong)*err);
  }
LAB_005176f3:
  cf->conn->sock[cf->sockindex] = cVar1;
  return uVar4;
}

Assistant:

static ssize_t cf_socket_send(struct Curl_cfilter *cf, struct Curl_easy *data,
                              const void *buf, size_t len, CURLcode *err)
{
  struct cf_socket_ctx *ctx = cf->ctx;
  curl_socket_t fdsave;
  ssize_t nwritten;
  size_t orig_len = len;

  *err = CURLE_OK;
  fdsave = cf->conn->sock[cf->sockindex];
  cf->conn->sock[cf->sockindex] = ctx->sock;

#ifdef DEBUGBUILD
  /* simulate network blocking/partial writes */
  if(ctx->wblock_percent > 0) {
    unsigned char c;
    Curl_rand(data, &c, 1);
    if(c >= ((100-ctx->wblock_percent)*256/100)) {
      CURL_TRC_CF(data, cf, "send(len=%zu) SIMULATE EWOULDBLOCK", orig_len);
      *err = CURLE_AGAIN;
      nwritten = -1;
      cf->conn->sock[cf->sockindex] = fdsave;
      return nwritten;
    }
  }
  if(cf->cft != &Curl_cft_udp && ctx->wpartial_percent > 0 && len > 8) {
    len = len * ctx->wpartial_percent / 100;
    if(!len)
      len = 1;
    CURL_TRC_CF(data, cf, "send(len=%zu) SIMULATE partial write of %zu bytes",
                orig_len, len);
  }
#endif

#if defined(MSG_FASTOPEN) && !defined(TCP_FASTOPEN_CONNECT) /* Linux */
  if(cf->conn->bits.tcp_fastopen) {
    nwritten = sendto(ctx->sock, buf, len, MSG_FASTOPEN,
                      &cf->conn->remote_addr->sa_addr,
                      cf->conn->remote_addr->addrlen);
    cf->conn->bits.tcp_fastopen = FALSE;
  }
  else
#endif
    nwritten = swrite(ctx->sock, buf, len);

  if(-1 == nwritten) {
    int sockerr = SOCKERRNO;

    if(
#ifdef WSAEWOULDBLOCK
      /* This is how Windows does it */
      (WSAEWOULDBLOCK == sockerr)
#else
      /* errno may be EWOULDBLOCK or on some systems EAGAIN when it returned
         due to its inability to send off data without blocking. We therefore
         treat both error codes the same here */
      (EWOULDBLOCK == sockerr) || (EAGAIN == sockerr) || (EINTR == sockerr) ||
      (EINPROGRESS == sockerr)
#endif
      ) {
      /* this is just a case of EWOULDBLOCK */
      *err = CURLE_AGAIN;
    }
    else {
      char buffer[STRERROR_LEN];
      failf(data, "Send failure: %s",
            Curl_strerror(sockerr, buffer, sizeof(buffer)));
      data->state.os_errno = sockerr;
      *err = CURLE_SEND_ERROR;
    }
  }

  CURL_TRC_CF(data, cf, "send(len=%zu) -> %d, err=%d",
              orig_len, (int)nwritten, *err);
  cf->conn->sock[cf->sockindex] = fdsave;
  return nwritten;
}